

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::Encode
          (Electromagnetic_Emission_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  pointer pEVar3;
  __normal_iterator<const_KDIS::DATA_TYPE::EmissionSystem_*,_std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  Electromagnetic_Emission_PDU *this_local;
  
  Header7::Encode(&this->super_Header,stream);
  pKVar2 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_EmittingEntityID);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,(DataTypeBase *)&this->m_EventID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8StateUpdateIndicator);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8NumberOfEmissionSystems);
  KDataStream::operator<<(pKVar2,this->m_ui16Padding);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
            ::begin(&this->m_vEmissionSystem);
  local_28._M_current =
       (EmissionSystem *)
       std::
       vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>::
       end(&this->m_vEmissionSystem);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    pEVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::EmissionSystem_*,_std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>_>
             ::operator->(&citrEnd);
    (*(pEVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pEVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::EmissionSystem_*,_std::vector<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void Electromagnetic_Emission_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_EmittingEntityID
           << KDIS_STREAM m_EventID
           << m_ui8StateUpdateIndicator
           << m_ui8NumberOfEmissionSystems
           << m_ui16Padding;

    vector<EmissionSystem>::const_iterator citr = m_vEmissionSystem.begin();
    vector<EmissionSystem>::const_iterator citrEnd = m_vEmissionSystem.end();
    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}